

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.c
# Opt level: O0

void * raviX_realloc_array(void *oldp,size_t element_size,size_t old_n,size_t new_n)

{
  char *p;
  size_t oldsize;
  void *newp;
  size_t newsize;
  size_t new_n_local;
  size_t old_n_local;
  size_t element_size_local;
  void *oldp_local;
  
  if (new_n == 0) {
    raviX_free(oldp);
    oldp_local = (void *)0x0;
  }
  else {
    if (new_n <= old_n) {
      __assert_fail("new_n > old_n",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/allocate.c"
                    ,0x40,"void *raviX_realloc_array(void *, size_t, size_t, size_t)");
    }
    oldp_local = realloc(oldp,element_size * new_n);
    if (oldp_local == (void *)0x0) {
      fprintf(_stderr,"out of memory\n");
      abort();
    }
    memset((void *)((long)oldp_local + old_n * element_size),0,
           element_size * new_n - old_n * element_size);
  }
  return oldp_local;
}

Assistant:

void *raviX_realloc_array(void *oldp, size_t element_size, size_t old_n, size_t new_n)
{
	if (new_n == 0) {
		raviX_free(oldp);
		return NULL;
	}
	assert(new_n > old_n);
	size_t newsize = element_size * new_n;
	void *newp = realloc(oldp, newsize);
	if (!newp) {
		fprintf(stderr, "out of memory\n");
		abort();
	}
	size_t oldsize = old_n * element_size;
	char *p = (char *)newp;
	memset(p + oldsize, 0, newsize - oldsize);
	return newp;
}